

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O2

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::GenConViol(SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                   *cvmap,MemoryWriter *wrt,int alg_log)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  allocator<char> local_ec;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *local_e8;
  MemoryWriter *local_e0;
  _Rb_tree_node_base *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((cvmap->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var4 = (cvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_d8 = &(cvmap->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_e8 = this;
    local_e0 = wrt;
    while( true ) {
      if (p_Var4 == local_d8) break;
      p_Var1 = p_Var4 + 1;
      iVar3 = std::__cxx11::string::compare((ulong)p_Var1,0,(char *)0x8);
      if (iVar3 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"aux algebr con(s)",&local_e9);
LAB_0015591c:
        bVar2 = false;
      }
      else {
        iVar3 = std::__cxx11::string::compare((ulong)p_Var1,0,(char *)0x4);
        if (iVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"algebraic con(s)",&local_ea);
          goto LAB_0015591c;
        }
        iVar3 = std::__cxx11::string::compare((ulong)p_Var1,0,(char *)0x9);
        if (iVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"aux quadr con(s)",&local_eb);
          goto LAB_0015591c;
        }
        iVar3 = std::__cxx11::string::compare((ulong)p_Var1,0,(char *)0x5);
        if (iVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"quadratic con(s)",&local_ec);
          goto LAB_0015591c;
        }
        std::__cxx11::string::string((string *)&local_b0,(string *)p_Var1);
        std::operator+(&local_90,"expr \'",&local_b0);
        std::operator+(&local_70,&local_90,"\'");
        bVar2 = true;
      }
      Gen1Viol(local_e8,(ViolSummary *)(p_Var4 + 2),local_e0,alg_log == 0,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::string((string *)&local_50,(string *)p_Var1);
      std::operator+(&local_d0,"interm expr \'",&local_50);
      std::operator+(&local_70,&local_d0,"\'");
      Gen1Viol(local_e8,(ViolSummary *)&p_Var4[3]._M_parent,local_e0,alg_log == 0,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,(string *)p_Var1);
      std::operator+(&local_d0,"final expr \'",&local_50);
      std::operator+(&local_70,&local_d0,"\'");
      Gen1Viol(local_e8,(ViolSummary *)&p_Var4[4]._M_left,local_e0,alg_log == 0,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    }
  }
  return;
}

Assistant:

void GenConViol(
      const std::map< std::string, ViolSummArray<3> >& cvmap,
      fmt::MemoryWriter& wrt, int alg_log) {
    if (cvmap.size()) {
      for (const auto& cva: cvmap) {
        Gen1Viol(cva.second.at(0), wrt, !alg_log,
                 0==cva.first.compare(0, 8, "_linfunc")
                 ? "aux algebr con(s)"
                 : 0==cva.first.compare(0, 4, "_lin")
                   ? "algebraic con(s)"
                 : 0==cva.first.compare(0, 9, "_quadfunc")
                   ? "aux quadr con(s)"
                 : 0==cva.first.compare(0, 5, "_quad")
                   ? "quadratic con(s)"
                 : "expr '"
                 + std::string(cva.first) + "'");
        Gen1Viol(cva.second.at(1), wrt, !alg_log,
                 "interm expr '"
                 + std::string(cva.first) + "'");
        Gen1Viol(cva.second.at(2), wrt, !alg_log,
                 "final expr '"
                 + std::string(cva.first) + "'");
      }
    }
  }